

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::clear_snapshot_sync_ctx(raft_server *this,peer *pp)

{
  element_type *peVar1;
  int iVar2;
  ptr<snapshot_sync_ctx> snp_ctx;
  string local_48;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  peer::get_snapshot_sync_ctx((peer *)&snp_ctx);
  if (snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,
               &snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>);
    destroy_user_snp_ctx(this,(ptr<snapshot_sync_ctx> *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
      if (5 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_48,"destroy snapshot sync ctx %p",
                   snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"clear_snapshot_sync_ctx",0x44,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
  }
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  peer::set_snapshot_in_sync(pp,(ptr<snapshot> *)&local_48,10000);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void raft_server::clear_snapshot_sync_ctx(peer& pp) {
    ptr<snapshot_sync_ctx> snp_ctx = pp.get_snapshot_sync_ctx();
    if (snp_ctx) {
        destroy_user_snp_ctx(snp_ctx);
        p_tr("destroy snapshot sync ctx %p", snp_ctx.get());
    }
    pp.set_snapshot_in_sync(nullptr);
}